

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

value_type * __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
::update(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
         *this,char_range key)

{
  compact_fkhash_nlm<int,_16UL> *this_00;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 *puVar4;
  char *pcVar5;
  uint32_t uVar6;
  value_type_conflict7 *unaff_RBP;
  ulong uVar7;
  pair<const_int_*,_unsigned_long> pVar8;
  uint64_t node_id;
  char_range local_230;
  map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
  local_220;
  
  local_230.end = key.end;
  local_230.begin = key.begin;
  if (local_230.begin == local_230.end) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_00185a10;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_230.end[-1] == 0) {
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_220,0,0x20);
          operator=(this,&local_220);
          compact_fkhash_nlm<int,_16UL>::~compact_fkhash_nlm(&local_220.label_store_);
          plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
                    (&local_220.hash_trie_);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        unaff_RBP = compact_fkhash_nlm<int,_16UL>::append(&this->label_store_,&local_230);
      }
      else {
        local_220._0_8_ = 0;
        this_00 = &this->label_store_;
        do {
          if (local_230.begin == local_230.end) {
            pVar8 = compact_fkhash_nlm<int,_16UL>::compare(this_00,local_220._0_8_,&local_230);
            return pVar8.first;
          }
          pVar8 = compact_fkhash_nlm<int,_16UL>::compare(this_00,local_220._0_8_,&local_230);
          uVar7 = pVar8.second;
          if (pVar8.first == (value_type_conflict7 *)0x0) {
            local_230.begin = local_230.begin + uVar7;
            if (this->lambda_ <= uVar7) {
              do {
                bVar2 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                                  (&this->hash_trie_,(uint64_t *)&local_220,0xff);
                if (bVar2) {
                  compact_fkhash_nlm<int,_16UL>::append_dummy(this_00);
                }
                uVar7 = uVar7 - this->lambda_;
              } while (this->lambda_ <= uVar7);
            }
            if ((this->codes_)._M_elems[*local_230.begin] == 0xff) {
              uVar1 = this->num_codes_;
              uVar6 = uVar1 + 1;
              this->num_codes_ = uVar6;
              (this->codes_)._M_elems[*local_230.begin] = (uchar)uVar1;
              if (uVar6 == 0xff) {
                puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
                *puVar4 = &PTR__exception_00185a10;
                pcVar5 = 
                "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
                ;
                goto LAB_0016975d;
              }
            }
            bVar3 = plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::add_child
                              (&this->hash_trie_,(uint64_t *)&local_220,
                               uVar7 << 8 | (ulong)(this->codes_)._M_elems[*local_230.begin]);
            local_230.begin = local_230.begin + 1;
            bVar2 = true;
            if (bVar3) {
              this->size_ = this->size_ + 1;
              unaff_RBP = compact_fkhash_nlm<int,_16UL>::append(this_00,&local_230);
              bVar2 = false;
            }
          }
          else {
            bVar2 = false;
            unaff_RBP = pVar8.first;
          }
        } while (bVar2);
      }
      return unaff_RBP;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_00185a10;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_0016975d:
  puVar4[1] = pcVar5;
  __cxa_throw(puVar4,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }